

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::ExpandVariablesCMP0019(cmMakefile *this)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var1;
  cmTarget *pcVar2;
  bool bVar3;
  byte bVar4;
  PolicyStatus PVar5;
  TargetType TVar6;
  string *psVar7;
  reference pbVar8;
  char *pcVar9;
  ostream *poVar10;
  cmake *this_00;
  PolicyID id;
  string_view arg;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  bool local_781;
  string local_628;
  string local_608 [32];
  string local_5e8;
  undefined1 local_5c8 [8];
  ostringstream m;
  string local_450 [32];
  undefined1 local_430 [8];
  string orig_1;
  undefined1 local_3b0 [8];
  string libName;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_388;
  iterator l;
  undefined1 local_370 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkLibs;
  string local_350;
  cmValue local_330;
  cmValue linkLibsProp;
  string orig;
  string d;
  string local_2e0;
  cmValue local_2c0;
  cmValue linkDirsProp;
  string local_2b0;
  undefined1 local_290 [8];
  string dirs_1;
  string local_268;
  string *local_248;
  cmTarget *local_240;
  cmTarget *t;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
  *target;
  iterator __end1;
  iterator __begin1;
  cmTargetMap *__range1;
  string local_210;
  undefined1 local_1f0 [8];
  string dirs;
  allocator<char> local_1b9;
  string local_1b8;
  cmValue local_198;
  cmValue includeDirs;
  ostringstream w;
  PolicyStatus pol;
  cmMakefile *this_local;
  
  PVar5 = GetPolicyStatus(this,CMP0019,false);
  if ((PVar5 == OLD) || (PVar5 == WARN)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&includeDirs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"INCLUDE_DIRECTORIES",&local_1b9);
    local_198 = GetProperty(this,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
    bVar3 = cmValue::operator_cast_to_bool(&local_198);
    if (bVar3) {
      cmValue::operator->[abi_cxx11_(&local_198);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      bVar3 = mightExpandVariablesCMP0019(pcVar9);
      if (bVar3) {
        psVar7 = cmValue::operator*[abi_cxx11_(&local_198);
        std::__cxx11::string::string((string *)local_1f0,(string *)psVar7);
        ExpandVariablesInString(this,(string *)local_1f0,true,true,false,(char *)0x0,-1,false,false)
        ;
        if (PVar5 == WARN) {
          psVar7 = cmValue::operator*[abi_cxx11_(&local_198);
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1f0,psVar7);
          if (bVar3) {
            poVar10 = std::operator<<((ostream *)&includeDirs,
                                      "Evaluated directory INCLUDE_DIRECTORIES\n");
            poVar10 = std::operator<<(poVar10,"  ");
            psVar7 = cmValue::operator*[abi_cxx11_(&local_198);
            poVar10 = std::operator<<(poVar10,(string *)psVar7);
            poVar10 = std::operator<<(poVar10,"\n");
            poVar10 = std::operator<<(poVar10,"as\n");
            poVar10 = std::operator<<(poVar10,"  ");
            poVar10 = std::operator<<(poVar10,(string *)local_1f0);
            std::operator<<(poVar10,"\n");
          }
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,"INCLUDE_DIRECTORIES",
                   (allocator<char> *)((long)&__range1 + 7));
        SetProperty(this,&local_210,(string *)local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
        std::__cxx11::string::~string((string *)local_1f0);
      }
    }
    __end1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
             ::begin(&this->Targets);
    target = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
              *)std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                ::end(&this->Targets);
    while (bVar3 = std::__detail::operator!=
                             (&__end1.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                              ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                                *)&target), bVar3) {
      t = (cmTarget *)
          std::__detail::
          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
          ::operator*(&__end1);
      local_240 = &((reference)t)->second;
      TVar6 = cmTarget::GetType(local_240);
      if ((TVar6 != INTERFACE_LIBRARY) &&
         (TVar6 = cmTarget::GetType(local_240), pcVar2 = local_240, TVar6 != GLOBAL_TARGET)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_268,"INCLUDE_DIRECTORIES",
                   (allocator<char> *)(dirs_1.field_2._M_local_buf + 0xf));
        local_248 = (string *)cmTarget::GetProperty(pcVar2,&local_268);
        local_198 = (cmValue)local_248;
        std::__cxx11::string::~string((string *)&local_268);
        std::allocator<char>::~allocator((allocator<char> *)(dirs_1.field_2._M_local_buf + 0xf));
        bVar3 = cmValue::operator_cast_to_bool(&local_198);
        if (bVar3) {
          cmValue::operator->[abi_cxx11_(&local_198);
          pcVar9 = (char *)std::__cxx11::string::c_str();
          bVar3 = mightExpandVariablesCMP0019(pcVar9);
          if (bVar3) {
            psVar7 = cmValue::operator*[abi_cxx11_(&local_198);
            std::__cxx11::string::string((string *)local_290,(string *)psVar7);
            ExpandVariablesInString
                      (this,(string *)local_290,true,true,false,(char *)0x0,-1,false,false);
            if (PVar5 == WARN) {
              psVar7 = cmValue::operator*[abi_cxx11_(&local_198);
              bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_290,psVar7);
              if (bVar3) {
                poVar10 = std::operator<<((ostream *)&includeDirs,"Evaluated target ");
                psVar7 = cmTarget::GetName_abi_cxx11_(local_240);
                poVar10 = std::operator<<(poVar10,(string *)psVar7);
                poVar10 = std::operator<<(poVar10," INCLUDE_DIRECTORIES\n");
                poVar10 = std::operator<<(poVar10,"  ");
                psVar7 = cmValue::operator*[abi_cxx11_(&local_198);
                poVar10 = std::operator<<(poVar10,(string *)psVar7);
                poVar10 = std::operator<<(poVar10,"\n");
                poVar10 = std::operator<<(poVar10,"as\n");
                poVar10 = std::operator<<(poVar10,"  ");
                poVar10 = std::operator<<(poVar10,(string *)local_290);
                std::operator<<(poVar10,"\n");
              }
            }
            pcVar2 = local_240;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2b0,"INCLUDE_DIRECTORIES",
                       (allocator<char> *)((long)&linkDirsProp.Value + 7));
            cmTarget::SetProperty(pcVar2,&local_2b0,(string *)local_290);
            std::__cxx11::string::~string((string *)&local_2b0);
            std::allocator<char>::~allocator((allocator<char> *)((long)&linkDirsProp.Value + 7));
            std::__cxx11::string::~string((string *)local_290);
          }
        }
      }
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
      ::operator++(&__end1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"LINK_DIRECTORIES",
               (allocator<char> *)(d.field_2._M_local_buf + 0xf));
    local_2c0 = GetProperty(this,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)(d.field_2._M_local_buf + 0xf));
    bVar3 = cmValue::operator_cast_to_bool(&local_2c0);
    if (bVar3) {
      cmValue::operator->[abi_cxx11_(&local_2c0);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      bVar3 = mightExpandVariablesCMP0019(pcVar9);
      if (bVar3) {
        psVar7 = cmValue::operator*[abi_cxx11_(&local_2c0);
        std::__cxx11::string::string((string *)(orig.field_2._M_local_buf + 8),(string *)psVar7);
        std::__cxx11::string::string
                  ((string *)&linkLibsProp,(string *)(orig.field_2._M_local_buf + 8));
        ExpandVariablesInString
                  (this,(string *)((long)&orig.field_2 + 8),true,true,false,(char *)0x0,-1,false,
                   false);
        if ((PVar5 == WARN) &&
           (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&orig.field_2 + 8),
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&linkLibsProp), bVar3)) {
          poVar10 = std::operator<<((ostream *)&includeDirs,"Evaluated link directories\n");
          poVar10 = std::operator<<(poVar10,"  ");
          poVar10 = std::operator<<(poVar10,(string *)&linkLibsProp);
          poVar10 = std::operator<<(poVar10,"\n");
          poVar10 = std::operator<<(poVar10,"as\n");
          poVar10 = std::operator<<(poVar10,"  ");
          poVar10 = std::operator<<(poVar10,(string *)(orig.field_2._M_local_buf + 8));
          std::operator<<(poVar10,"\n");
        }
        std::__cxx11::string::~string((string *)&linkLibsProp);
        std::__cxx11::string::~string((string *)(orig.field_2._M_local_buf + 8));
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,"LINK_LIBRARIES",
               (allocator<char> *)
               ((long)&linkLibs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_330 = GetProperty(this,&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&linkLibs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    bVar3 = cmValue::operator_cast_to_bool(&local_330);
    if (bVar3) {
      psVar7 = cmValue::operator*[abi_cxx11_(&local_330);
      arg = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
      l._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arg._M_len
      ;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_370,arg,false);
      local_388._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_370);
      while( true ) {
        libName.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_370);
        bVar3 = __gnu_cxx::operator!=
                          (&local_388,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&libName.field_2 + 8));
        if (!bVar3) break;
        pbVar8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_388);
        std::__cxx11::string::string((string *)local_3b0,(string *)pbVar8);
        _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_3b0);
        bVar11 = (basic_string_view<char,_std::char_traits<char>_>)
                 ::cm::operator____s("optimized",9);
        bVar3 = std::operator==(_Var1,bVar11);
        local_781 = true;
        if (!bVar3) {
          _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_3b0);
          bVar11 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("debug",5);
          orig_1.field_2._8_8_ = bVar11._M_len;
          local_781 = std::operator==(_Var1,bVar11);
        }
        if (local_781 != false) {
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_388);
          pbVar8 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_388);
          std::__cxx11::string::operator=((string *)local_3b0,(string *)pbVar8);
        }
        pcVar9 = (char *)std::__cxx11::string::c_str();
        bVar3 = mightExpandVariablesCMP0019(pcVar9);
        if (bVar3) {
          std::__cxx11::string::string((string *)local_430,(string *)local_3b0);
          ExpandVariablesInString
                    (this,(string *)local_3b0,true,true,false,(char *)0x0,-1,false,false);
          if ((PVar5 == WARN) &&
             (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_3b0,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_430), bVar3)) {
            poVar10 = std::operator<<((ostream *)&includeDirs,"Evaluated link library\n");
            poVar10 = std::operator<<(poVar10,"  ");
            poVar10 = std::operator<<(poVar10,(string *)local_430);
            poVar10 = std::operator<<(poVar10,"\n");
            poVar10 = std::operator<<(poVar10,"as\n");
            poVar10 = std::operator<<(poVar10,"  ");
            poVar10 = std::operator<<(poVar10,(string *)local_3b0);
            std::operator<<(poVar10,"\n");
          }
          std::__cxx11::string::~string((string *)local_430);
        }
        std::__cxx11::string::~string((string *)local_3b0);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_388);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_370);
    }
    std::__cxx11::ostringstream::str();
    bVar4 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_450);
    if (((bVar4 ^ 0xff) & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c8);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_5e8,(cmPolicies *)0x13,id);
      poVar10 = std::operator<<((ostream *)local_5c8,(string *)&local_5e8);
      poVar10 = std::operator<<(poVar10,"\n");
      poVar10 = std::operator<<(poVar10,"The following variable evaluations were encountered:\n");
      std::__cxx11::ostringstream::str();
      std::operator<<(poVar10,local_608);
      std::__cxx11::string::~string(local_608);
      std::__cxx11::string::~string((string *)&local_5e8);
      this_00 = GetCMakeInstance(this);
      std::__cxx11::ostringstream::str();
      cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_628,&this->Backtrace);
      std::__cxx11::string::~string((string *)&local_628);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c8);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&includeDirs);
  }
  return;
}

Assistant:

void cmMakefile::ExpandVariablesCMP0019()
{
  // Drop this ancient compatibility behavior with a policy.
  cmPolicies::PolicyStatus pol = this->GetPolicyStatus(cmPolicies::CMP0019);
  if (pol != cmPolicies::OLD && pol != cmPolicies::WARN) {
    return;
  }
  std::ostringstream w;

  cmValue includeDirs = this->GetProperty("INCLUDE_DIRECTORIES");
  if (includeDirs && mightExpandVariablesCMP0019(includeDirs->c_str())) {
    std::string dirs = *includeDirs;
    this->ExpandVariablesInString(dirs, true, true);
    if (pol == cmPolicies::WARN && dirs != *includeDirs) {
      /* clang-format off */
      w << "Evaluated directory INCLUDE_DIRECTORIES\n"
        << "  " << *includeDirs << "\n"
        << "as\n"
        << "  " << dirs << "\n";
      /* clang-format on */
    }
    this->SetProperty("INCLUDE_DIRECTORIES", dirs);
  }

  // Also for each target's INCLUDE_DIRECTORIES property:
  for (auto& target : this->Targets) {
    cmTarget& t = target.second;
    if (t.GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        t.GetType() == cmStateEnums::GLOBAL_TARGET) {
      continue;
    }
    includeDirs = t.GetProperty("INCLUDE_DIRECTORIES");
    if (includeDirs && mightExpandVariablesCMP0019(includeDirs->c_str())) {
      std::string dirs = *includeDirs;
      this->ExpandVariablesInString(dirs, true, true);
      if (pol == cmPolicies::WARN && dirs != *includeDirs) {
        /* clang-format off */
        w << "Evaluated target " << t.GetName() << " INCLUDE_DIRECTORIES\n"
          << "  " << *includeDirs << "\n"
          << "as\n"
          << "  " << dirs << "\n";
        /* clang-format on */
      }
      t.SetProperty("INCLUDE_DIRECTORIES", dirs);
    }
  }

  if (cmValue linkDirsProp = this->GetProperty("LINK_DIRECTORIES")) {
    if (mightExpandVariablesCMP0019(linkDirsProp->c_str())) {
      std::string d = *linkDirsProp;
      const std::string orig = d;
      this->ExpandVariablesInString(d, true, true);
      if (pol == cmPolicies::WARN && d != orig) {
        /* clang-format off */
        w << "Evaluated link directories\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << d << "\n";
        /* clang-format on */
      }
    }
  }

  if (cmValue linkLibsProp = this->GetProperty("LINK_LIBRARIES")) {
    std::vector<std::string> linkLibs = cmExpandedList(*linkLibsProp);

    for (auto l = linkLibs.begin(); l != linkLibs.end(); ++l) {
      std::string libName = *l;
      if (libName == "optimized"_s || libName == "debug"_s) {
        ++l;
        libName = *l;
      }
      if (mightExpandVariablesCMP0019(libName.c_str())) {
        const std::string orig = libName;
        this->ExpandVariablesInString(libName, true, true);
        if (pol == cmPolicies::WARN && libName != orig) {
          /* clang-format off */
        w << "Evaluated link library\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << libName << "\n";
          /* clang-format on */
        }
      }
    }
  }

  if (!w.str().empty()) {
    std::ostringstream m;
    /* clang-format off */
    m << cmPolicies::GetPolicyWarning(cmPolicies::CMP0019)
      << "\n"
      << "The following variable evaluations were encountered:\n"
      << w.str();
    /* clang-format on */
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           m.str(), this->Backtrace);
  }
}